

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O0

void __thiscall helics::apps::Recorder::addEndpoint(Recorder *this,string_view endpoint)

{
  bool bVar1;
  int iVar2;
  InterfaceHandle IVar3;
  pointer ppVar4;
  size_type sVar5;
  reference this_00;
  mapped_type *pmVar6;
  undefined1 uVar7;
  deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *in_RDI;
  bool bVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_helics::InterfaceHandle,_int>_>,_bool> pVar9;
  InterfaceHandle endpointId;
  int index;
  iterator res;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  *in_stack_ffffffffffffff78;
  basic_string_view<char,_std::char_traits<char>_> *__args_2;
  CombinationFederate **in_stack_ffffffffffffff80;
  Interface *this_01;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined7 in_stack_ffffffffffffffb9;
  int iVar10;
  _Self local_28;
  _Self local_20 [4];
  
  local_20[0]._M_node =
       (_Base_ptr)
       CLI::std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::find(in_stack_ffffffffffffff78,(key_type *)0x17b3a4);
  local_28._M_node =
       (_Base_ptr)
       CLI::std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::end(in_stack_ffffffffffffff78);
  bVar1 = CLI::std::operator==(local_20,&local_28);
  bVar8 = true;
  if (!bVar1) {
    ppVar4 = CLI::std::
             _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                           *)0x17b3e5);
    bVar8 = ppVar4->second == -1;
  }
  if (bVar8) {
    __args_2 = (basic_string_view<char,_std::char_traits<char>_> *)
               &in_RDI[3].super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node;
    CLI::std::__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>::get
              ((__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2> *)
               &(in_RDI->super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>).
                _M_impl.super__Deque_impl_data._M_map_size);
    std::deque<helics::Endpoint,std::allocator<helics::Endpoint>>::
    emplace_back<helics::InterfaceVisibility,helics::CombinationFederate*,std::basic_string_view<char,std::char_traits<char>>&>
              (in_RDI,(InterfaceVisibility *)
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               in_stack_ffffffffffffff80,__args_2);
    sVar5 = CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::size
                      ((deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)0x17b44e);
    iVar2 = (int)sVar5 + -1;
    this_00 = CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::back(in_RDI);
    IVar3 = Interface::getHandle(&this_00->super_Interface);
    pVar9 = std::
            map<helics::InterfaceHandle,int,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,int>>>
            ::emplace<helics::InterfaceHandle&,int&>
                      ((map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
                        *)in_RDI,
                       (InterfaceHandle *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       (int *)in_stack_ffffffffffffff80);
    uVar7 = pVar9.second;
    this_01 = (Interface *)
              &in_RDI[7].super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>.
               _M_impl.super__Deque_impl_data._M_map_size;
    iVar10 = iVar2;
    CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::back(in_RDI);
    Interface::getName_abi_cxx11_(this_01);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
    pmVar6 = CLI::std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
             ::operator[]((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                           *)CONCAT44(iVar10,IVar3.hid),
                          (key_type *)CONCAT71(in_stack_ffffffffffffffb9,uVar7));
    *pmVar6 = iVar2;
  }
  return;
}

Assistant:

void Recorder::addEndpoint(std::string_view endpoint)
{
    auto res = eptNames.find(endpoint);
    if ((res == eptNames.end()) || (res->second == -1)) {
        endpoints.emplace_back(InterfaceVisibility::GLOBAL, fed.get(), endpoint);
        auto index = static_cast<int>(endpoints.size()) - 1;
        auto endpointId = endpoints.back().getHandle();
        eptids.emplace(endpointId, index);  // this is a new element
        eptNames[endpoints.back().getName()] = index;  // this is a potential replacement
    }
}